

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_gameboard.cpp
# Opt level: O2

void Field::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == fieldClicked) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    fieldClicked((Field *)_o,*_a[1],*_a[2]);
    return;
  }
  return;
}

Assistant:

void Field::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Field *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->fieldClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Field::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Field::fieldClicked)) {
                *result = 0;
                return;
            }
        }
    }
}